

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_start_renegotiation(mbedtls_ssl_context *ssl)

{
  uint uVar1;
  mbedtls_ssl_config *pmVar2;
  int iVar3;
  
  iVar3 = ssl_handshake_init(ssl);
  if (iVar3 == 0) {
    pmVar2 = ssl->conf;
    uVar1 = *(uint *)&pmVar2->field_0x174;
    if (((uVar1 & 2) != 0) && (ssl->renego_status == 3)) {
      if ((uVar1 & 1) == 0) {
        ssl->handshake->in_msg_seq = 1;
      }
      else {
        ssl->handshake->out_msg_seq = 1;
      }
    }
    ssl->state = 0;
    ssl->renego_status = 1;
    if (pmVar2 == (mbedtls_ssl_config *)0x0) {
      iVar3 = -0x7100;
    }
    else {
      do {
        if (ssl->state == 0x10) {
          return 0;
        }
        iVar3 = mbedtls_ssl_handshake_step(ssl);
      } while (iVar3 == 0);
    }
  }
  return iVar3;
}

Assistant:

static int ssl_start_renegotiation( mbedtls_ssl_context *ssl )
{
    int ret;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> renegotiate" ) );

    if( ( ret = ssl_handshake_init( ssl ) ) != 0 )
        return( ret );

    /* RFC 6347 4.2.2: "[...] the HelloRequest will have message_seq = 0 and
     * the ServerHello will have message_seq = 1" */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_PENDING )
    {
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
            ssl->handshake->out_msg_seq = 1;
        else
            ssl->handshake->in_msg_seq = 1;
    }
#endif

    ssl->state = MBEDTLS_SSL_HELLO_REQUEST;
    ssl->renego_status = MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS;

    if( ( ret = mbedtls_ssl_handshake( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_handshake", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= renegotiate" ) );

    return( 0 );
}